

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  CopyingFileOutputStream *pCVar1;
  pointer ppFVar2;
  FileDescriptor *this_00;
  bool bVar3;
  iterator iVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  int i;
  int iVar10;
  string *psVar11;
  int i_1;
  FileDescriptor *dependency;
  FileOutputStream out;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  
  FileDescriptorSet::FileDescriptorSet(&file_set);
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_seen._M_t._M_impl.super__Rb_tree_header._M_header;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->imports_in_descriptor_set_ == false) {
    pCVar1 = &out.copying_output_;
    out.copying_output_.super_CopyingOutputStream._vptr_CopyingOutputStream._0_4_ = 0;
    out.copying_output_.file_ = 0;
    out.copying_output_.close_on_delete_ = false;
    out.copying_output_.is_closed_ = false;
    out.copying_output_._14_2_ = 0;
    out.impl_.copying_stream_ = (CopyingOutputStream *)0x0;
    out.copying_output_._16_8_ = pCVar1;
    out.impl_.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = (_func_int **)pCVar1;
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const*const*,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>>
              ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)&out,(__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                        )(parsed_files->
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                )(parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    for (uVar8 = 0;
        ppFVar2 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3);
        uVar8 = uVar8 + 1) {
      this_00 = ppFVar2[uVar8];
      for (iVar10 = 0; iVar10 < *(int *)(this_00 + 0x20); iVar10 = iVar10 + 1) {
        dependency = FileDescriptor::dependency(this_00,iVar10);
        iVar4 = std::
                _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::find((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)&out,&dependency);
        if (iVar4._M_node == (_Base_ptr)pCVar1) {
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)&already_seen,&dependency);
        }
      }
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)&out);
  }
  for (uVar8 = 0;
      ppFVar2 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(parsed_files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3);
      uVar8 = uVar8 + 1) {
    GetTransitiveDependencies
              (ppFVar2[uVar8],true,this->source_info_in_descriptor_set_,&already_seen,
               &file_set.file_);
  }
  psVar11 = &this->descriptor_set_out_name_;
  do {
    iVar10 = open((psVar11->_M_dataplus)._M_p,0x241,0x1b6);
    if (-1 < iVar10) {
      io::FileOutputStream::FileOutputStream(&out,iVar10,-1);
      bVar3 = MessageLite::SerializeToZeroCopyStream
                        ((MessageLite *)&file_set,&out.super_ZeroCopyOutputStream);
      if (bVar3) {
        bVar3 = io::FileOutputStream::Close(&out);
        bVar9 = true;
        if (!bVar3) {
          poVar6 = std::operator<<((ostream *)&std::cerr,(string *)psVar11);
          poVar6 = std::operator<<(poVar6,": ");
          pcVar7 = strerror(out.copying_output_.errno_);
          poVar6 = std::operator<<(poVar6,pcVar7);
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_0026cf1b;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)psVar11);
        poVar6 = std::operator<<(poVar6,": ");
        pcVar7 = strerror(out.copying_output_.errno_);
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        io::FileOutputStream::Close(&out);
LAB_0026cf1b:
        bVar9 = false;
      }
      io::FileOutputStream::~FileOutputStream(&out);
      goto LAB_0026cf27;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  perror((psVar11->_M_dataplus)._M_p);
  bVar9 = false;
LAB_0026cf27:
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&already_seen._M_t);
  FileDescriptorSet::~FileDescriptorSet(&file_set);
  return bVar9;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const std::vector<const FileDescriptor*>& parsed_files) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  if (!imports_in_descriptor_set_) {
    // Since we don't want to output transitive dependencies, but we do want
    // things to be in dependency order, add all dependencies that aren't in
    // parsed_files to already_seen.  This will short circuit the recursion
    // in GetTransitiveDependencies.
    std::set<const FileDescriptor*> to_output;
    to_output.insert(parsed_files.begin(), parsed_files.end());
    for (int i = 0; i < parsed_files.size(); i++) {
      const FileDescriptor* file = parsed_files[i];
      for (int i = 0; i < file->dependency_count(); i++) {
        const FileDescriptor* dependency = file->dependency(i);
        // if the dependency isn't in parsed files, mark it as already seen
        if (to_output.find(dependency) == to_output.end()) {
          already_seen.insert(dependency);
        }
      }
    }
  }
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name
                              source_info_in_descriptor_set_, &already_seen,
                              file_set.mutable_file());
  }

  int fd;
  do {
    fd = open(descriptor_set_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}